

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

void xmlCleanupCharEncodingHandlers(void)

{
  char *pcVar1;
  ulong uVar2;
  
  xmlCleanupEncodingAliases();
  if (handlers != (xmlCharEncodingHandlerPtr *)0x0) {
    uVar2 = (ulong)(uint)nbCharEncodingHandler;
    while (0 < (int)uVar2) {
      nbCharEncodingHandler = (int)uVar2 - 1;
      uVar2 = (ulong)(uint)nbCharEncodingHandler;
      if (handlers[uVar2] != (xmlCharEncodingHandlerPtr)0x0) {
        pcVar1 = handlers[uVar2]->name;
        if (pcVar1 != (char *)0x0) {
          (*xmlFree)(pcVar1);
        }
        (*xmlFree)(handlers[nbCharEncodingHandler]);
        uVar2 = (ulong)(uint)nbCharEncodingHandler;
      }
    }
    (*xmlFree)(handlers);
    handlers = (xmlCharEncodingHandlerPtr *)0x0;
    nbCharEncodingHandler = 0;
  }
  return;
}

Assistant:

void
xmlCleanupCharEncodingHandlers(void) {
    xmlCleanupEncodingAliases();

    if (handlers == NULL) return;

    for (;nbCharEncodingHandler > 0;) {
        nbCharEncodingHandler--;
	if (handlers[nbCharEncodingHandler] != NULL) {
	    if (handlers[nbCharEncodingHandler]->name != NULL)
		xmlFree(handlers[nbCharEncodingHandler]->name);
	    xmlFree(handlers[nbCharEncodingHandler]);
	}
    }
    xmlFree(handlers);
    handlers = NULL;
    nbCharEncodingHandler = 0;
    xmlDefaultCharEncodingHandler = NULL;
}